

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

int __thiscall Bstrlib::CBString::find(CBString *this,char *b,int pos)

{
  uchar c;
  uint uVar1;
  uchar *puVar2;
  int iVar3;
  CBStringException *this_00;
  long lVar4;
  uchar uVar5;
  int iVar6;
  int iVar7;
  long lVar9;
  long lVar10;
  allocator local_69;
  string local_68;
  CBStringException bstr__cppwrapper_exception;
  ulong uVar8;
  
  if (b == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_68,"CBString::CBString::find NULL.",&local_69);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  uVar1 = (this->super_tagbstring).slen;
  iVar3 = -1;
  if (((uVar1 < (uint)pos) || (c = *b, iVar3 = pos, c == '\0')) || (iVar3 = -1, uVar1 == pos)) {
    return iVar3;
  }
  if (b[1] == '\0') {
    iVar3 = find(this,c,pos);
    return iVar3;
  }
  lVar4 = (long)(int)uVar1 + -1;
  puVar2 = (this->super_tagbstring).data;
  iVar3 = -1;
  do {
    uVar8 = 0;
    uVar5 = c;
    do {
      iVar7 = (int)uVar8;
      lVar10 = (long)pos;
      iVar6 = 0;
      while( true ) {
        lVar9 = (long)iVar7;
        if (lVar4 <= lVar10) {
          if ((pos - uVar1) + 1 != iVar6) {
            return -1;
          }
          if (uVar5 != puVar2[lVar4]) {
            return -1;
          }
          pos = (int)lVar4;
          if (b[lVar9 + 1] != '\0') {
            return -1;
          }
          goto LAB_0014b94f;
        }
        if (uVar5 == puVar2[lVar10]) {
          iVar6 = pos - iVar6;
          goto LAB_0014b91d;
        }
        if (uVar5 == puVar2[lVar10 + 1]) break;
        lVar10 = lVar10 + 2;
        iVar6 = iVar6 + -2;
      }
      iVar6 = (pos - iVar6) + 1;
LAB_0014b91d:
      if (iVar7 == 0) {
        iVar3 = iVar6;
      }
      pos = iVar6 + 1;
      uVar5 = b[lVar9 + 1];
      uVar8 = lVar9 + 1U & 0xffffffff;
      iVar7 = (int)(lVar9 + 1U);
    } while (uVar5 != '\0');
LAB_0014b94f:
    if (pos == iVar3 + iVar7) {
      return iVar3;
    }
    pos = pos - iVar7;
  } while( true );
}

Assistant:

int CBString::find (const char * b, int pos) const {
int ii, j;
unsigned char c0;
int i, l;
unsigned char cx;
unsigned char * pdata;

	if (NULL == b) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("CBString::find NULL.");
#else
		return BSTR_ERR;
#endif
	}

	if ((unsigned int) pos > (unsigned int) slen) return BSTR_ERR;
	if ('\0' == b[0]) return pos;
	if (pos == slen) return BSTR_ERR;
	if ('\0' == b[1]) return find (b[0], pos);

	cx = c0 = (unsigned char) b[0];
	l = slen - 1;

	pdata = data;
	for (ii = -1, i = pos, j = 0; i < l;) {
		/* Unrolled current character test */
		if (cx != pdata[i]) {
			if (cx != pdata[1+i]) {
				i += 2;
				continue;
			}
			i++;
		}

		/* Take note if this is the start of a potential match */
		if (0 == j) ii = i;

		/* Shift the test character down by one */
		j++;
		i++;

		/* If this isn't past the last character continue */
		if ('\0' != (cx = b[j])) continue;

		N0:;

		/* If no characters mismatched, then we matched */
		if (i == ii+j) return ii;

		/* Shift back to the beginning */
		i -= j;
		j = 0;
		cx = c0;
	}

	/* Deal with last case if unrolling caused a misalignment */
	if (i == l && cx == pdata[i] && '\0' == b[j+1]) goto N0;

	return BSTR_ERR;
}